

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O3

void __thiscall
covenant::CondEpsGen<covenant::Sym>::CondEpsGen
          (CondEpsGen<covenant::Sym> *this,cfg_digest_t *_digest,
          vector<int,_std::allocator<int>_> *_word,TermFactory *tfac)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  sp_counted_base *psVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  pointer piVar5;
  int iVar6;
  pointer piVar7;
  cfg_digest_t *pcVar8;
  ulong uVar9;
  pointer piVar10;
  uint qj;
  uint qi;
  int iVar11;
  emplace_return eVar12;
  allocator_type local_79;
  value_type local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  this->digest = _digest;
  local_40 = &this->word;
  std::vector<int,_std::allocator<int>_>::vector(local_40,_word);
  iVar6 = (int)((ulong)((long)(this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + 1;
  this->nstates = iVar6;
  iVar11 = this->digest->nprods;
  this->nprods = iVar11;
  local_48 = &this->produce_fwd;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_48,(long)(iVar6 * iVar11),&local_78,&local_79);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_50 = &this->produce_rev;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_50,(long)this->nprods * (long)this->nstates,&local_78,&local_79);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this_00 = &this->produced;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,(long)this->nprods * (long)this->nstates * (long)this->nstates,
             (bool *)&local_78,(allocator_type *)&local_79);
  this->head = 0;
  local_58 = &this->eps_preds;
  (this->lim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->lim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->lim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->added).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->added).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->added).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->declim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->declim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->declim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->decisions).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decisions).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decisions).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_58,(long)this->nstates,&local_78,&local_79);
  local_38 = this_00;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->eps_succs,(long)this->nstates,&local_78,&local_79);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (this->_tfac).px = tfac->px;
  psVar1 = (tfac->pn).pi_;
  (this->_tfac).pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  piVar10 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar7 = piVar5;
  if (piVar5 != piVar10) {
    uVar4 = 0;
    piVar5 = piVar10;
    qi = 0;
    do {
      eVar12 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
               ::try_emplace_unique<int_const&>
                         ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
                           *)&this->digest->term_prods,piVar5 + uVar4);
      qj = qi + 1;
      for (p_Var3 = *(_Rb_tree_node_base **)
                     ((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 0x20);
          p_Var3 != (_Rb_tree_node_base *)
                    ((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 0x10);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        addProd(this,qi,p_Var3[1]._M_color,qj);
      }
      uVar4 = (ulong)qj;
      piVar5 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      qi = qj;
    } while (uVar4 < (ulong)((long)piVar7 - (long)piVar5 >> 2));
  }
  pcVar8 = this->digest;
  uVar4 = 0;
  do {
    piVar10 = (pcVar8->nullable_prods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar11 = (int)uVar4;
    if ((pcVar8->nullable_prods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar10) {
      uVar4 = 0;
      uVar9 = 1;
      do {
        addProd(this,iVar11,piVar10[uVar4],iVar11);
        pcVar8 = this->digest;
        piVar10 = (pcVar8->nullable_prods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar2 = uVar9 < (ulong)((long)(pcVar8->nullable_prods).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar10 >> 2);
        uVar4 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
      piVar5 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    uVar4 = (ulong)(iVar11 + 1);
  } while (uVar4 <= (ulong)((long)piVar7 - (long)piVar5 >> 2));
  update_prods(this);
  return;
}

Assistant:

CondEpsGen(cfg_digest_t& _digest, const vector<int>& _word, TermFactory tfac)
        : digest(_digest), word(_word),
          nstates(1+word.size()), nprods(digest.nprods),
          produce_fwd(vector< vector<int> >(nstates*nprods, vector<int>())),
          produce_rev(vector< vector<int> >(nstates*nprods, vector<int>())),
          produced(vector<bool>(nstates*nstates*nprods, false)),
          //      produced((bool*) calloc(nstates*nstates*nprods, sizeof(bool))),
          head(0),
          eps_preds(nstates, vector<int>()),
          eps_succs(nstates, vector<int>()),
          _tfac(tfac)
    {
      // Assumption -- g is semi-normalized.
      // Single productions may be nullable, but
      // terminals may only occur in singleton productions; this means
      // we only need |P||Q|^2 space, rather than (|P|+|Sigma|)|Q|^2.
      
      // Initialize the leaf transitions.  
      for(unsigned int ci = 0; ci < word.size(); ci++)
      {
        set<int>& sing(digest.term_prods[word[ci]]);
        
        set<int>::iterator it;
        for(it = sing.begin(); it != sing.end(); ++it)
        {
          addProd(ci, *it, ci+1);
        }
      }
      
      // Add empty productions
      for(unsigned int ci = 0; ci <= word.size(); ci++)
      {
        for(unsigned int pi = 0; pi < digest.nullable_prods.size(); pi++)
        {
          addProd(ci, digest.nullable_prods[pi], ci);
        }
      }
      // Since we know we only recognize w, we can either
      // use the standard propagation approach, or use
      // a standard(-ish) CYK implementation.
      
      // For now, we'll use the worklist approach, since
      // it's already implemented.
      update_prods(); 
    }